

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

void __thiscall
QMimeXMLProvider::findByMagic(QMimeXMLProvider *this,QByteArray *data,QMimeMagicResult *result)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  QMimeMagicRuleMatcher *matcher;
  QMimeMagicRuleMatcher *this_00;
  long in_FS_OFFSET;
  Data *pDVar6;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->m_magicMatchers).d.ptr;
  for (lVar5 = (this->m_magicMatchers).d.size * 0x38; lVar5 != 0; lVar5 = lVar5 + -0x38) {
    bVar3 = QMimeMagicRuleMatcher::matches(this_00,data);
    if ((bVar3) && (uVar4 = QMimeMagicRuleMatcher::priority(this_00), result->accuracy < (int)uVar4)
       ) {
      result->accuracy = uVar4;
      pDVar6 = (this_00->m_mimetype).d.d;
      pcVar1 = (this_00->m_mimetype).d.ptr;
      qVar2 = (this_00->m_mimetype).d.size;
      if (pDVar6 == (Data *)0x0) {
        pDVar6 = (Data *)0x0;
      }
      else {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_48.d = (result->candidate).d.d;
      local_48.ptr = (result->candidate).d.ptr;
      (result->candidate).d.d = pDVar6;
      (result->candidate).d.ptr = pcVar1;
      local_48.size = (result->candidate).d.size;
      (result->candidate).d.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
    this_00 = this_00 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::findByMagic(const QByteArray &data, QMimeMagicResult &result)
{
    for (const QMimeMagicRuleMatcher &matcher : std::as_const(m_magicMatchers)) {
        if (matcher.matches(data)) {
            const int priority = matcher.priority();
            if (priority > result.accuracy) {
                result.accuracy = priority;
                result.candidate = matcher.mimetype();
            }
        }
    }
}